

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O2

RayTracerConfig * RayTracerConfig::fromPlyFile(RayTracerConfig *__return_storage_ptr__,string *path)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  pointer pTVar9;
  char cVar12;
  bool bVar13;
  istream *piVar14;
  void *pvVar15;
  ostream *poVar16;
  invalid_argument *piVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  byte bVar21;
  int iVar22;
  int i;
  int iVar23;
  Vector VVar24;
  long local_320;
  ifstream file;
  int aiStack_300 [122];
  undefined1 auStack_118 [8];
  vector<Point,_std::allocator<Point>_> vertices;
  undefined1 local_f8 [8];
  Vector v;
  undefined1 auStack_d8 [8];
  vector<RGB,_std::allocator<RGB>_> colors;
  undefined1 local_b0 [8];
  string sss;
  uint8_t uStack_88;
  uint8_t uStack_87;
  uint8_t uStack_86;
  uint8_t uStack_85;
  undefined1 local_68 [8];
  string token;
  int local_40;
  int vertexCount;
  int faceCount;
  int g;
  int b;
  int v3;
  
  std::ifstream::ifstream(&local_320,(string *)path,_S_in);
  cVar12 = std::__basic_file<char>::is_open();
  if (cVar12 == '\0') {
    piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   "Unable to open file: ",path);
    std::invalid_argument::invalid_argument(piVar17,(string *)local_b0);
    __cxa_throw(piVar17,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (__return_storage_ptr__->super_BaseConfig).antiAliasing = 2;
  (__return_storage_ptr__->super_BaseConfig).maxRecursionLevel = 1;
  (__return_storage_ptr__->super_BaseConfig).ambientCoefficient = 0.1;
  (__return_storage_ptr__->super_BaseConfig).background.r = '\0';
  (__return_storage_ptr__->super_BaseConfig).background.g = '\0';
  (__return_storage_ptr__->super_BaseConfig).background.b = '\0';
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = (undefined1  [8])&token._M_string_length;
  token._M_dataplus._M_p = (pointer)0x0;
  token._M_string_length._0_1_ = 0;
  std::operator>>((istream *)&local_320,(string *)local_68);
  bVar13 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,"ply");
  if (!bVar13) {
    std::operator>>((istream *)&local_320,(string *)local_68);
    bVar13 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,"format");
    if (bVar13) {
      piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar17,"Missing \'format\' specifier.");
      __cxa_throw(piVar17,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_320,(string *)local_68);
    token.field_2._12_4_ = 0;
    local_40 = 0;
    auStack_118 = (undefined1  [8])0x0;
    vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vertices.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    auStack_d8 = (undefined1  [8])0x0;
    colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    bVar21 = 0;
    do {
      piVar14 = std::operator>>((istream *)&local_320,(string *)local_68);
      if (((byte)piVar14[*(long *)(*(long *)piVar14 + -0x18) + 0x20] & 5) != 0) {
        std::_Vector_base<RGB,_std::allocator<RGB>_>::~_Vector_base
                  ((_Vector_base<RGB,_std::allocator<RGB>_> *)auStack_d8);
        std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
                  ((_Vector_base<Point,_std::allocator<Point>_> *)auStack_118);
        std::__cxx11::string::~string((string *)local_68);
        std::ifstream::~ifstream(&local_320);
        return __return_storage_ptr__;
      }
      bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_68,"comment");
      if (bVar13) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_320,(string *)local_68);
      }
      bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_68,"element");
      if (bVar13) {
        std::operator>>((istream *)&local_320,(string *)local_68);
        std::istream::operator>>((istream *)&local_320,(int *)(token.field_2._M_local_buf + 0xc));
        bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_68,"vertex");
        if (bVar13) {
          std::operator>>((istream *)&local_320,(string *)local_68);
          while( true ) {
            bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_68,"property");
            if (!bVar13) break;
            std::operator>>((istream *)&local_320,(string *)local_68);
            bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_68,"uchar");
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_320,(string *)local_68);
            bVar21 = bVar21 | bVar13;
            std::operator>>((istream *)&local_320,(string *)local_68);
          }
        }
        std::operator>>((istream *)&local_320,(string *)local_68);
        std::istream::operator>>((istream *)&local_320,&local_40);
        bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_68,"face");
        if (!bVar13) {
          piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,"Unknown element \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_f8,"\', only \'vertex\' and \'face\' are supported");
          std::invalid_argument::invalid_argument(piVar17,(string *)local_b0);
          __cxa_throw(piVar17,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::operator>>((istream *)&local_320,(string *)local_68);
        while( true ) {
          bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_68,"property");
          if (!bVar13) break;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_320,(string *)local_68);
          std::operator>>((istream *)&local_320,(string *)local_68);
        }
      }
      bVar13 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_68,"end_header");
      if (bVar13) {
        for (iVar23 = 0; iVar23 < (int)token.field_2._12_4_; iVar23 = iVar23 + 1) {
          piVar14 = std::istream::_M_extract<float>((float *)&local_320);
          piVar14 = std::istream::_M_extract<float>((float *)piVar14);
          std::istream::_M_extract<float>((float *)piVar14);
          std::vector<Point,_std::allocator<Point>_>::push_back
                    ((vector<Point,_std::allocator<Point>_> *)auStack_118,(value_type *)local_f8);
          if (bVar21 == 0) {
            local_b0._0_3_ = 0x646464;
            std::vector<RGB,_std::allocator<RGB>_>::emplace_back<RGB>
                      ((vector<RGB,_std::allocator<RGB>_> *)auStack_d8,(RGB *)local_b0);
          }
          else {
            pvVar15 = (void *)std::istream::operator>>((istream *)&local_320,(int *)local_b0);
            pvVar15 = (void *)std::istream::operator>>(pvVar15,&vertexCount);
            std::istream::operator>>(pvVar15,&faceCount);
            iVar22 = g;
            g._3_1_ = SUB41(iVar22,3);
            g._0_3_ = CONCAT12((undefined1)faceCount,CONCAT11((undefined1)vertexCount,local_b0[0]));
            std::vector<RGB,_std::allocator<RGB>_>::emplace_back<RGB>
                      ((vector<RGB,_std::allocator<RGB>_> *)auStack_d8,(RGB *)&g);
          }
          local_b0 = (undefined1  [8])&sss._M_string_length;
          sss._M_dataplus._M_p._0_4_ = 0.0;
          sss._M_dataplus._M_p._4_4_ = 0;
          sss._M_string_length._0_4_ = (uint)sss._M_string_length & 0xffffff00;
          iVar22 = 0xb;
          while (bVar13 = iVar22 != 0, iVar22 = iVar22 + -1, bVar13) {
            std::operator>>((istream *)&local_320,(string *)local_b0);
          }
          std::__cxx11::string::~string((string *)local_b0);
        }
        for (iVar23 = 0; iVar23 < local_40; iVar23 = iVar23 + 1) {
          std::istream::operator>>((istream *)&local_320,(int *)local_f8);
          if ((float)local_f8._0_4_ == 4.2039e-45) {
            pvVar15 = (void *)std::istream::operator>>((istream *)&local_320,&vertexCount);
            pvVar15 = (void *)std::istream::operator>>(pvVar15,&faceCount);
            std::istream::operator>>(pvVar15,&g);
            if (auStack_d8 ==
                (undefined1  [8])
                colors.super__Vector_base<RGB,_std::allocator<RGB>_>._M_impl.super__Vector_impl_data
                ._M_start) {
              sss._M_dataplus._M_p._0_4_ =
                   ((pointer)((long)auStack_118 + (long)vertexCount * 0xc))->z;
              local_b0 = *(undefined1 (*) [8])((long)auStack_118 + (long)vertexCount * 0xc);
              uVar8 = ((pointer)((long)auStack_118 + (long)faceCount * 0xc))->x;
              uVar11 = ((pointer)((long)auStack_118 + (long)faceCount * 0xc))->y;
              sss._M_string_length._4_4_ = ((pointer)((long)auStack_118 + (long)faceCount * 0xc))->z
              ;
              sss.field_2._0_4_ = ((pointer)((long)auStack_118 + (long)g * 0xc))->x;
              sss.field_2._4_4_ = ((pointer)((long)auStack_118 + (long)g * 0xc))->y;
              sss.field_2._8_4_ = ((pointer)((long)auStack_118 + (long)g * 0xc))->z;
              sss.field_2._12_1_ = '(';
              sss.field_2._13_1_ = 200;
              sss.field_2._14_1_ = '(';
              sss.field_2._15_1_ = '2';
              uStack_88 = '2';
              uStack_87 = 200;
              uStack_86 = '\0';
              uStack_85 = '\0';
              sss._M_dataplus._M_p._4_4_ = uVar8;
              sss._M_string_length._0_4_ = uVar11;
              std::vector<Triangle,_std::allocator<Triangle>_>::emplace_back<Triangle>
                        (&__return_storage_ptr__->triangles,(Triangle *)local_b0);
            }
            else {
              lVar18 = (long)vertexCount;
              sss._M_dataplus._M_p._0_4_ = ((pointer)((long)auStack_118 + lVar18 * 0xc))->z;
              local_b0 = *(undefined1 (*) [8])((long)auStack_118 + lVar18 * 0xc);
              lVar19 = (long)faceCount;
              sss._M_string_length._4_4_ = ((pointer)((long)auStack_118 + lVar19 * 0xc))->z;
              uVar7 = ((pointer)((long)auStack_118 + lVar19 * 0xc))->x;
              uVar10 = ((pointer)((long)auStack_118 + lVar19 * 0xc))->y;
              lVar20 = (long)g;
              sss.field_2._8_4_ = ((pointer)((long)auStack_118 + lVar20 * 0xc))->z;
              sss.field_2._0_4_ = ((pointer)((long)auStack_118 + lVar20 * 0xc))->x;
              sss.field_2._4_4_ = ((pointer)((long)auStack_118 + lVar20 * 0xc))->y;
              uVar1 = ((pointer)((long)auStack_d8 + lVar18 * 3))->r;
              uVar4 = ((pointer)((long)auStack_d8 + lVar18 * 3))->g;
              sss.field_2._13_1_ = uVar4;
              sss.field_2._12_1_ = uVar1;
              sss.field_2._14_1_ = ((pointer)((long)auStack_d8 + lVar18 * 3))->b;
              uVar2 = ((pointer)((long)auStack_d8 + lVar19 * 3))->r;
              uVar5 = ((pointer)((long)auStack_d8 + lVar19 * 3))->g;
              uStack_88 = uVar5;
              sss.field_2._15_1_ = uVar2;
              uStack_87 = ((pointer)((long)auStack_d8 + lVar19 * 3))->b;
              uVar3 = ((pointer)((long)auStack_d8 + lVar20 * 3))->r;
              uVar6 = ((pointer)((long)auStack_d8 + lVar20 * 3))->g;
              uStack_85 = uVar6;
              uStack_86 = uVar3;
              sss._M_dataplus._M_p._4_4_ = uVar7;
              sss._M_string_length._0_4_ = uVar10;
              std::vector<Triangle,_std::allocator<Triangle>_>::emplace_back<Triangle>
                        (&__return_storage_ptr__->triangles,(Triangle *)local_b0);
            }
            VVar24 = getNormalVector((__return_storage_ptr__->triangles).
                                     super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                                     .super__Vector_impl_data._M_finish + -1);
            pTVar9 = (__return_storage_ptr__->triangles).
                     super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pTVar9[-1].normal.x = (float)(int)VVar24._0_8_;
            pTVar9[-1].normal.y = (float)(int)((ulong)VVar24._0_8_ >> 0x20);
            pTVar9[-1].normal.z = VVar24.z;
          }
          else {
            poVar16 = std::operator<<((ostream *)&std::cerr,"Warning: only triangles are supported")
            ;
            std::endl<char,std::char_traits<char>>(poVar16);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&local_320,(string *)local_68);
          }
        }
      }
    } while (*(int *)((long)aiStack_300 + *(long *)(local_320 + -0x18)) == 0);
    piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar17,"Invalid config file format.");
    __cxa_throw(piVar17,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar17 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 "Not a .ply file: ",path);
  std::invalid_argument::invalid_argument(piVar17,(string *)local_b0);
  __cxa_throw(piVar17,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

RayTracerConfig RayTracerConfig::fromPlyFile(std::string const& path)
{
  std::ifstream file(path);
  if (!file.is_open())
    throw std::invalid_argument("Unable to open file: " + path);

  RayTracerConfig config;
  std::string token;
  file >> token;
  if (token != "ply")
    throw std::invalid_argument("Not a .ply file: " + path);
  file >> token;
  if (token != "format")
    throw std::invalid_argument("Missing 'format' specifier.");
  std::getline(file, token);

  int vertexCount = 0;
  int faceCount = 0;

  std::vector<Vector> vertices;
  std::vector<RGB> colors;
  bool isRGB = false;
  while (file >> token)
  {
    if (token == "comment")
      std::getline(file, token);
    if (token == "element")
    {
      file >> token;
      file >> vertexCount;
      if (token == "vertex")
      {
        // assume format x y z, ignore other
        file >> token;
        while (token == "property")
        {
          file >> token;
          if (token == "uchar")
            isRGB = true;

          std::getline(file, token);
          file >> token;
        }
      }
      file >> token;
      file >> faceCount;
      if (token == "face")
      {
        // assume property list uchar int vertex_indices
        file >> token;
        while (token == "property")
        {
          std::getline(file, token);
          file >> token;
        }
      }
      else
        throw std::invalid_argument("Unknown element '" + token
                                    + "', only 'vertex' and 'face' are supported");
    }
    if (token == "end_header")
    {
      for (int i = 0; i < vertexCount; ++i)
      {
        Vector v;
        file >> v.x >> v.y >> v.z;
        vertices.push_back(v);

        if (isRGB)
        {
          int r, g, b;
          file >> r >> g >> b;
          colors.push_back({uint8_t(r), uint8_t(g), uint8_t(b)});
        }
        else
          colors.push_back({100, 100, 100});
        
        // only for sponza
        std::string sss; for(int j=0; j<11; j++) file >> sss;
      }

      for (int i = 0; i < faceCount; ++i)
      {
        int count;
        file >> count;
        if (count != 3) // only triangles supported
        {
          std::cerr << "Warning: only triangles are supported" << std::endl;
          std::getline(file, token);
          continue;
        }
        int v1, v2, v3;
        file >> v1 >> v2 >> v3;
        // RGB color{uint8_t(rand() % 200), uint8_t(rand() % 200), uint8_t(rand() % 200)};
        if (colors.empty())
          config.triangles.emplace_back(Triangle{
              vertices[v1], vertices[v2], vertices[v3], {40, 200, 40}, {50, 50, 200}, {0, 0, 0}});
        else
          config.triangles.emplace_back(Triangle{vertices[v1], vertices[v2], vertices[v3],
                                                 colors[v1], colors[v2], colors[v3]});
        config.triangles[config.triangles.size()-1].normal = getNormalVector(config.triangles[config.triangles.size()-1]);
      }
    }
    // else
    //  throw std::invalid_argument("Unknown token '" + token + "'");
    if (!file.good())
      throw std::invalid_argument("Invalid config file format.");
  }
  return config;
}